

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  ushort uVar1;
  ValueHolder VVar2;
  ushort uVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  bool bVar6;
  char *pcVar7;
  iterator __pos;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  CZString key;
  value_type defaultValue;
  undefined1 local_1f0 [32];
  ValueHolder local_1d0;
  ushort local_1c8;
  undefined2 uStack_1c6;
  ValueHolder local_1c0;
  ValueHolder VStack_1b8;
  ValueHolder local_1b0;
  ValueHolder local_1a8;
  uint local_1a0;
  Value local_198 [9];
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
LAB_00124229:
    uVar3 = (ushort)_local_1c8 & 0xfe00;
    local_1c0 = (ValueHolder)0x0;
    VStack_1b8 = (ValueHolder)0x0;
    local_1b0 = (ValueHolder)0x0;
    local_1c8 = uVar3 + 6;
    pcVar7 = (char *)operator_new(0x30);
    pcVar7[0x10] = '\0';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\0';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\0';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0x20] = '\0';
    pcVar7[0x21] = '\0';
    pcVar7[0x22] = '\0';
    pcVar7[0x23] = '\0';
    pcVar7[0x24] = '\0';
    pcVar7[0x25] = '\0';
    pcVar7[0x26] = '\0';
    pcVar7[0x27] = '\0';
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    *(char **)(pcVar7 + 0x18) = pcVar7 + 8;
    *(char **)(pcVar7 + 0x20) = pcVar7 + 8;
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    *(ushort *)((long)this + 8) = uVar1 & 0xff00 | 6;
    local_1d0.map_ = *(ObjectValues **)this;
    *(char **)this = pcVar7;
    *(ushort *)((long)this + 8) = uVar1 & 0xfe00 | 6;
    _local_1c8 = CONCAT22(uStack_1c6,uVar1 & 0x100 | uVar3 + (uVar1 & 0xff));
    VVar2 = *(ValueHolder *)((long)this + 0x10);
    ((ValueHolder *)((long)this + 0x10))->int_ = (LargestInt)local_1c0;
    VVar4 = *(ValueHolder *)((long)this + 0x18);
    VVar5 = *(ValueHolder *)((long)this + 0x20);
    ((ValueHolder *)((long)this + 0x18))->int_ = (LargestInt)VStack_1b8;
    ((ValueHolder *)((long)this + 0x20))->int_ = (LargestInt)local_1b0;
    local_1c0 = VVar2;
    VStack_1b8 = VVar4;
    local_1b0 = VVar5;
    ~Value((Value *)&local_1d0);
  }
  else if ((char)uVar1 != '\x06') {
    this = (Value *)&local_1a8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"in Json::Value::operator[](ArrayIndex): requires arrayValue",0x3b);
    std::__cxx11::stringbuf::str();
    throwLogicError((string *)local_1f0);
    goto LAB_00124229;
  }
  local_1f0._0_8_ = (pointer)0x0;
  p_Var9 = ((*(ObjectValues **)this)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &((*(ObjectValues **)this)->_M_t)._M_impl.super__Rb_tree_header;
  __pos._M_node = &p_Var8->_M_header;
  local_1f0._8_4_ = index;
  if (p_Var9 != (_Base_ptr)0x0) {
    do {
      bVar6 = CZString::operator<((CZString *)(p_Var9 + 1),(CZString *)local_1f0);
      if (!bVar6) {
        __pos._M_node = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[bVar6];
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  if ((_Rb_tree_header *)__pos._M_node != p_Var8) {
    bVar6 = CZString::operator==((CZString *)(__pos._M_node + 1),(CZString *)local_1f0);
    if (bVar6) goto LAB_0012439a;
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            ((pair<const_Json::Value::CZString,_Json::Value> *)&local_1a8,(CZString *)local_1f0,
             (Value *)kNull);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    (*(_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                       **)this,__pos._M_node,
                     (pair<const_Json::Value::CZString,_Json::Value> *)&local_1a8);
  ~Value(local_198);
  if ((local_1a8 != (void *)0x0) && ((local_1a0 & 3) == 1)) {
    free(local_1a8.string_);
  }
LAB_0012439a:
  if (((pointer)local_1f0._0_8_ != (pointer)0x0) && ((local_1f0._8_4_ & 3) == 1)) {
    free((void *)local_1f0._0_8_);
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  ObjectValues::iterator it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullRef);
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}